

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void par_shapes_remove_degenerate(par_shapes_mesh *mesh,float mintriarea)

{
  long lVar1;
  float *pfVar2;
  ushort *puVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ushort *puVar7;
  ushort *puVar8;
  ulong uVar9;
  ulong uVar10;
  long *in_FS_OFFSET;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  lVar1 = *in_FS_OFFSET;
  puVar3 = (ushort *)(*(code *)in_FS_OFFSET[-0x85])(lVar1 + -0x430,1);
  iVar4 = 0;
  iVar5 = mesh->ntriangles;
  if (mesh->ntriangles < 1) {
    iVar5 = iVar4;
  }
  puVar7 = mesh->triangles + 2;
  puVar8 = puVar3;
  while( true ) {
    bVar11 = iVar5 == 0;
    iVar5 = iVar5 + -1;
    if (bVar11) break;
    pfVar2 = mesh->points;
    uVar9 = (ulong)puVar7[-2];
    uVar10 = (ulong)puVar7[-1];
    uVar6 = (ulong)*puVar7;
    fVar13 = pfVar2[uVar10 * 3] - pfVar2[uVar9 * 3];
    fVar15 = pfVar2[uVar10 * 3 + 1] - pfVar2[uVar9 * 3 + 1];
    fVar12 = pfVar2[uVar10 * 3 + 2] - pfVar2[uVar9 * 3 + 2];
    fVar17 = pfVar2[uVar6 * 3] - pfVar2[uVar9 * 3];
    fVar14 = pfVar2[uVar6 * 3 + 1] - pfVar2[uVar9 * 3 + 1];
    fVar18 = pfVar2[uVar6 * 3 + 2] - pfVar2[uVar9 * 3 + 2];
    fVar16 = fVar15 * fVar18 - fVar14 * fVar12;
    fVar12 = fVar12 * fVar17 - fVar18 * fVar13;
    fVar13 = fVar14 * fVar13 - fVar17 * fVar15;
    if (3.9999996e-08 <= fVar13 * fVar13 + fVar16 * fVar16 + fVar12 * fVar12) {
      *puVar8 = puVar7[-2];
      puVar8[1] = puVar7[-1];
      puVar8[2] = *puVar7;
      puVar8 = puVar8 + 3;
      iVar4 = iVar4 + 1;
    }
    puVar7 = puVar7 + 3;
  }
  mesh->ntriangles = iVar4;
  (*(code *)in_FS_OFFSET[-0x85])(lVar1 + -0x430,3);
  mesh->triangles = puVar3;
  return;
}

Assistant:

PARDEF void par_shapes_remove_degenerate(par_shapes_mesh* mesh, float mintriarea)
{
    int ntriangles = 0;
    PAR_SHAPES_T* triangles = PAR_MALLOC(PAR_SHAPES_T, mesh->ntriangles * 3);
    PAR_SHAPES_T* dst = triangles;
    PAR_SHAPES_T const* src = mesh->triangles;
    float next[3], prev[3], cp[3];
    float mincplen2 = (mintriarea * 2) * (mintriarea * 2);
    for (int f = 0; f < mesh->ntriangles; f++, src += 3) {
        float const* pa = mesh->points + 3 * src[0];
        float const* pb = mesh->points + 3 * src[1];
        float const* pc = mesh->points + 3 * src[2];
        par_shapes__copy3(next, pb);
        par_shapes__subtract3(next, pa);
        par_shapes__copy3(prev, pc);
        par_shapes__subtract3(prev, pa);
        par_shapes__cross3(cp, next, prev);
        float cplen2 = par_shapes__dot3(cp, cp);
        if (cplen2 >= mincplen2) {
            *dst++ = src[0];
            *dst++ = src[1];
            *dst++ = src[2];
            ntriangles++;
        }
    }
    mesh->ntriangles = ntriangles;
    PAR_FREE(mesh->triangles);
    mesh->triangles = triangles;
}